

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

void __thiscall
flatbuffers::rust::RustGenerator::ForAllUnionVariantsBesidesNone
          (RustGenerator *this,EnumDef *def,function<void_(const_flatbuffers::EnumVal_&)> *cb)

{
  Namespace *ns;
  StructDef *name;
  bool bVar1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar2;
  reference ppEVar3;
  string local_140;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  allocator<char> local_59;
  string local_58;
  EnumVal *local_38;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_28;
  const_iterator it;
  function<void_(const_flatbuffers::EnumVal_&)> *cb_local;
  EnumDef *def_local;
  RustGenerator *this_local;
  
  it._M_current = (EnumVal **)cb;
  if ((def->is_union & 1U) == 0) {
    __assert_fail("def.is_union",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                  ,0x656,
                  "void flatbuffers::rust::RustGenerator::ForAllUnionVariantsBesidesNone(const EnumDef &, std::function<void (const EnumVal &)>)"
                 );
  }
  pvVar2 = EnumDef::Vals(def);
  local_28._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2);
  while( true ) {
    pvVar2 = EnumDef::Vals(def);
    ev = (EnumVal *)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar2);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                        *)&ev);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_28);
    local_38 = *ppEVar3;
    if ((local_38->union_type).base_type != BASE_TYPE_NONE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"U_ELEMENT_ENUM_TYPE",&local_59);
      ns = (def->super_Definition).defined_namespace;
      IdlNamer::EnumVariant_abi_cxx11_(&local_b0,&this->namer_,def,local_38);
      WrapInNameSpace(&local_90,this,ns,&local_b0);
      CodeWriter::SetValue(&this->code_,&local_58,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"U_ELEMENT_TABLE_TYPE",&local_d1);
      name = (local_38->union_type).struct_def;
      WrapInNameSpace(&local_f8,this,(name->super_Definition).defined_namespace,(string *)name);
      CodeWriter::SetValue(&this->code_,&local_d0,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"U_ELEMENT_NAME",&local_119);
      Namer::Function(&local_140,&(this->namer_).super_Namer,&local_38->name);
      CodeWriter::SetValue(&this->code_,&local_118,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      std::function<void_(const_flatbuffers::EnumVal_&)>::operator()(cb,local_38);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void ForAllUnionVariantsBesidesNone(
      const EnumDef &def, std::function<void(const EnumVal &ev)> cb) {
    FLATBUFFERS_ASSERT(def.is_union);

    for (auto it = def.Vals().begin(); it != def.Vals().end(); ++it) {
      const EnumVal &ev = **it;
      // TODO(cneo): Can variants be deprecated, should we skip them?
      if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
      code_.SetValue(
          "U_ELEMENT_ENUM_TYPE",
          WrapInNameSpace(def.defined_namespace, namer_.EnumVariant(def, ev)));
      code_.SetValue(
          "U_ELEMENT_TABLE_TYPE",
          WrapInNameSpace(ev.union_type.struct_def->defined_namespace,
                          ev.union_type.struct_def->name));
      code_.SetValue("U_ELEMENT_NAME", namer_.Function(ev.name));
      cb(ev);
    }
  }